

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBaf.c
# Opt level: O2

Abc_Ntk_t * Io_ReadBaf(char *pFileName,int fCheck)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint nItemsTotal;
  FILE *__stream;
  char *__ptr;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *p;
  void **ppvVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  ProgressBar *p_00;
  void *pvVar7;
  void *pvVar8;
  char *__nptr;
  long lVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  size_t __size;
  
  iVar2 = Extra_FileSize(pFileName);
  __stream = fopen(pFileName,"rb");
  __size = (size_t)iVar2;
  __ptr = (char *)malloc(__size);
  fread(__ptr,__size,1,__stream);
  fclose(__stream);
  pcVar15 = __ptr;
  while (cVar1 = *pcVar15, __nptr = pcVar15, cVar1 == '#') {
    cVar1 = '#';
    while (pcVar15 = pcVar15 + 1, cVar1 != '\n') {
      cVar1 = *pcVar15;
    }
  }
  while (__nptr = __nptr + 1, cVar1 != '\0') {
    cVar1 = *__nptr;
  }
  iVar2 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  iVar3 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  iVar4 = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  nItemsTotal = atoi(__nptr);
  do {
    cVar1 = *__nptr;
    __nptr = __nptr + 1;
  } while (cVar1 != '\0');
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar15 = Extra_UtilStrsav(pcVar15);
  pNtk->pName = pcVar15;
  pcVar15 = Extra_UtilStrsav(pFileName);
  pNtk->pSpec = pcVar15;
  p = (Vec_Ptr_t *)malloc(0x10);
  iVar14 = 8;
  if (6 < iVar4 + iVar2 + nItemsTotal) {
    iVar14 = nItemsTotal + iVar4 + iVar2 + 1;
  }
  p->nSize = 0;
  p->nCap = iVar14;
  iVar10 = 0;
  if (iVar14 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar14 << 3);
  }
  p->pArray = ppvVar5;
  pAVar6 = Abc_AigConst1(pNtk);
  Vec_PtrPush(p,pAVar6);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar10 != iVar2; iVar10 = iVar10 + 1) {
    pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    Abc_ObjAssignName(pAVar6,__nptr,(char *)0x0);
    do {
      cVar1 = *__nptr;
      __nptr = __nptr + 1;
    } while (cVar1 != '\0');
    Vec_PtrPush(p,pAVar6);
  }
  iVar14 = 0;
  iVar2 = 0;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  for (; iVar14 != iVar2; iVar14 = iVar14 + 1) {
    pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
    Abc_ObjAssignName(pAVar6,__nptr,(char *)0x0);
    do {
      cVar1 = *__nptr;
      __nptr = __nptr + 1;
    } while (cVar1 != '\0');
  }
  iVar14 = 0;
  iVar2 = 0;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  for (; iVar14 != iVar2; iVar14 = iVar14 + 1) {
    pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
    Abc_ObjAssignName(pAVar6,__nptr,(char *)0x0);
    do {
      cVar1 = *__nptr;
      __nptr = __nptr + 1;
    } while (cVar1 != '\0');
    pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
    Abc_ObjAssignName(pObj,__nptr,(char *)0x0);
    do {
      cVar1 = *__nptr;
      __nptr = __nptr + 1;
    } while (cVar1 != '\0');
    pObj_00 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
    Abc_ObjAssignName(pObj_00,__nptr,(char *)0x0);
    do {
      cVar1 = *__nptr;
      __nptr = __nptr + 1;
    } while (cVar1 != '\0');
    Vec_PtrPush(p,pObj_00);
    Abc_ObjAddFanin(pAVar6,pObj);
    Abc_ObjAddFanin(pObj_00,pAVar6);
  }
  lVar11 = __size + (long)(int)(iVar4 + iVar3 + nItemsTotal * 2) * -4;
  if (__ptr + lVar11 == __nptr) {
    p_00 = Extra_ProgressBarStart(_stdout,nItemsTotal);
    uVar16 = 0;
    uVar13 = (ulong)nItemsTotal;
    if ((int)nItemsTotal < 1) {
      uVar13 = uVar16;
    }
    for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      if ((p_00 == (ProgressBar *)0x0) || ((long)p_00->nItemsNext <= (long)uVar16)) {
        Extra_ProgressBarUpdate_int(p_00,(int)uVar16,(char *)0x0);
      }
      pvVar7 = Vec_PtrEntry(p,*(uint *)(__ptr + uVar16 * 8 + lVar11) >> 1);
      uVar12 = *(uint *)(__ptr + uVar16 * 8 + lVar11);
      pvVar8 = Vec_PtrEntry(p,*(uint *)(__ptr + uVar16 * 8 + lVar11 + 4) >> 1);
      pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                          (Abc_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)pvVar7),
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)(__ptr + uVar16 * 8 + lVar11 + 4) & 1) ^ (ulong)pvVar8))
      ;
      Vec_PtrPush(p,pAVar6);
    }
    Extra_ProgressBarStop(p_00);
    for (lVar9 = 0; lVar9 < pNtk->vCos->nSize; lVar9 = lVar9 + 1) {
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCos,(int)lVar9);
      uVar12 = *(uint *)(__ptr + lVar11 + lVar9 * 4 + (long)(int)(nItemsTotal * 2) * 4);
      if ((0 < (pAVar6->vFanouts).nSize) &&
         (pvVar7 = pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray],
         (*(uint *)((long)pvVar7 + 0x14) & 0xf) == 8)) {
        *(ulong *)((long)pvVar7 + 0x38) = (ulong)(uVar12 & 3);
        uVar12 = (int)uVar12 >> 2;
      }
      pvVar7 = Vec_PtrEntry(p,(int)uVar12 >> 1);
      Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)pvVar7));
    }
    free(__ptr);
    Vec_PtrFree(p);
    if (fCheck == 0) {
      return pNtk;
    }
    iVar2 = Abc_NtkCheckRead(pNtk);
    if (iVar2 != 0) {
      return pNtk;
    }
    puts("Io_ReadBaf: The network check has failed.");
    Abc_NtkDelete(pNtk);
  }
  else {
    free(__ptr);
    Vec_PtrFree(p);
    Abc_NtkDelete(pNtk);
    puts("Warning: Internal reader error.");
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Io_ReadBaf( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nInputs, nOutputs, nLatches, nAnds, nFileSize, Num, i;
    char * pContents, * pName, * pCur;
    unsigned * pBufferNode;
    int RetValue;

    // read the file into the buffer
    nFileSize = Extra_FileSize( pFileName );
    pFile = fopen( pFileName, "rb" );
    pContents = ABC_ALLOC( char, nFileSize );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );

    // skip the comments (comment lines begin with '#' and end with '\n')
    for ( pCur = pContents; *pCur == '#'; )
        while ( *pCur++ != '\n' );

    // read the name
    pName = pCur;             while ( *pCur++ );
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur++ );
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur++ );
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur++ );
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur++ );

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_AigConst1(pNtkNew) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ );
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 
    }
    // create the latches
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 

        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_ObjAssignName( pNode0, pCur, NULL );  while ( *pCur++ ); 

        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAssignName( pNode1, pCur, NULL );  while ( *pCur++ ); 
        Vec_PtrPush( vNodes, pNode1 );

        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
    }

    // get the pointer to the beginning of the node array
    pBufferNode = (unsigned *)(pContents + (nFileSize - (2 * nAnds + nOutputs + nLatches) * sizeof(int)) );
    // make sure we are at the place where the nodes begin
    if ( pBufferNode != (unsigned *)pCur )
    {
        ABC_FREE( pContents );
        Vec_PtrFree( vNodes );
        Abc_NtkDelete( pNtkNew );
        printf( "Warning: Internal reader error.\n" );
        return NULL;
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+0] >> 1), pBufferNode[2*i+0] & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+1] >> 1), pBufferNode[2*i+1] & 1 );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // read the POs
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        Num = pBufferNode[2*nAnds+i];
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
        {
            Abc_ObjSetData( Abc_ObjFanout0(pObj), (void *)(ABC_PTRINT_T)(Num & 3) );
            Num >>= 2;
        }
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, Num >> 1), Num & 1 );
        Abc_ObjAddFanin( pObj, pNode0 );
    }
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
//    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadBaf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;

}